

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64InstPrinter.c
# Opt level: O2

void printShifter(MCInst *MI,uint OpNum,SStream *O)

{
  cs_detail *pcVar1;
  AArch64_AM_ShiftExtendType ST;
  undefined4 uVar2;
  MCOperand *op;
  ulong uVar3;
  char *pcVar4;
  uint val;
  
  op = MCInst_getOperand(MI,OpNum);
  uVar3 = MCOperand_getImm(op);
  ST = AArch64_AM_getShiftType((uint)uVar3);
  val = (uint)uVar3 & 0x3f;
  if ((uVar3 & 0x3f) != 0 || ST != AArch64_AM_LSL) {
    pcVar4 = AArch64_AM_getShiftExtendName(ST);
    SStream_concat(O,", %s ",pcVar4);
    printInt32BangDec(O,val);
    if (MI->csh->detail != CS_OPT_OFF) {
      if ((uint)(ST + AArch64_AM_InvalidShiftExtend) < 4) {
        uVar2 = *(undefined4 *)
                 (&DAT_001dd8e8 + (ulong)(uint)(ST + AArch64_AM_InvalidShiftExtend) * 4);
      }
      else {
        uVar2 = 1;
      }
      pcVar1 = MI->flat_insn->detail;
      *(undefined4 *)(pcVar1->regs_write + (ulong)(pcVar1->field_6).x86.opcode[2] * 0x30 + 7) =
           uVar2;
      pcVar1 = MI->flat_insn->detail;
      *(uint *)(pcVar1->groups + (ulong)(pcVar1->field_6).x86.opcode[2] * 0x30 + -10) = val;
    }
  }
  return;
}

Assistant:

static void printShifter(MCInst *MI, unsigned OpNum, SStream *O)
{
	unsigned Val = (unsigned)MCOperand_getImm(MCInst_getOperand(MI, OpNum));

	// LSL #0 should not be printed.
	if (AArch64_AM_getShiftType(Val) == AArch64_AM_LSL &&
			AArch64_AM_getShiftValue(Val) == 0)
		return;

	SStream_concat(O, ", %s ", AArch64_AM_getShiftExtendName(AArch64_AM_getShiftType(Val)));
	printInt32BangDec(O, AArch64_AM_getShiftValue(Val));
	if (MI->csh->detail) {
		arm64_shifter shifter = ARM64_SFT_INVALID;
		switch(AArch64_AM_getShiftType(Val)) {
			default:	// never reach
			case AArch64_AM_LSL:
				shifter = ARM64_SFT_LSL;
				break;
			case AArch64_AM_LSR:
				shifter = ARM64_SFT_LSR;
				break;
			case AArch64_AM_ASR:
				shifter = ARM64_SFT_ASR;
				break;
			case AArch64_AM_ROR:
				shifter = ARM64_SFT_ROR;
				break;
			case AArch64_AM_MSL:
				shifter = ARM64_SFT_MSL;
				break;
		}

		MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count - 1].shift.type = shifter;
		MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count - 1].shift.value = AArch64_AM_getShiftValue(Val);
	}
}